

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMEntityImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMEntityImpl::DOMEntityImpl(DOMEntityImpl *this,DOMDocument *ownerDoc,XMLCh *eName)

{
  short *psVar1;
  code *pcVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined4 extraout_var;
  DOMNode *ownerNode;
  _func_int *p_Var7;
  XMLCh *pXVar8;
  XMLCh XVar9;
  _func_int **pp_Var10;
  _func_int **pp_Var11;
  _func_int *p_Var6;
  
  (this->super_DOMEntity).super_DOMNode._vptr_DOMNode = (_func_int **)&PTR__DOMEntityImpl_00410a20;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl = (_func_int **)&PTR__DOMEntityImpl_00410bf0;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl = (_func_int **)&PTR__DOMEntityImpl_00410c20
  ;
  ownerNode = &ownerDoc->super_DOMNode;
  if (ownerDoc == (DOMDocument *)0x0) {
    ownerNode = (DOMNode *)0x0;
  }
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,ownerNode);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,ownerDoc);
  this->fXmlVersion = (XMLCh *)0x0;
  this->fBaseURI = (XMLCh *)0x0;
  this->fInputEncoding = (XMLCh *)0x0;
  this->fXmlEncoding = (XMLCh *)0x0;
  this->fNotationName = (XMLCh *)0x0;
  this->fRefEntity = (DOMEntityReference *)0x0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fEntityRefNodeCloned = false;
  if (eName == (XMLCh *)0x0) {
    pp_Var10 = (_func_int **)0x0;
  }
  else {
    lVar5 = 0;
    do {
      psVar1 = (short *)((long)eName + lVar5);
      lVar5 = lVar5 + 2;
    } while (*psVar1 != 0);
    uVar4 = (ulong)(ushort)*eName;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      XVar9 = eName[1];
      if (XVar9 != L'\0') {
        pXVar8 = eName + 2;
        do {
          uVar4 = (ulong)(ushort)XVar9 + (uVar4 >> 0x18) + uVar4 * 0x26;
          XVar9 = *pXVar8;
          pXVar8 = pXVar8 + 1;
        } while (XVar9 != L'\0');
      }
      uVar4 = uVar4 % (ulong)ownerDoc[9].super_DOMNode._vptr_DOMNode;
    }
    p_Var7 = (_func_int *)((lVar5 >> 1) + -1);
    pp_Var11 = ownerDoc[9].super_DOMDocumentTraversal._vptr_DOMDocumentTraversal;
    pp_Var10 = (_func_int **)pp_Var11[uVar4];
    if (pp_Var10 == (_func_int **)0x0) {
      pp_Var11 = pp_Var11 + uVar4;
    }
    else {
      do {
        pp_Var11 = pp_Var10;
        if (pp_Var11[1] == p_Var7) {
          pp_Var10 = pp_Var11 + 2;
          if (pp_Var10 == (_func_int **)eName) goto LAB_002751bf;
          lVar5 = 0;
          do {
            pcVar2 = (code *)((long)pp_Var10 + lVar5);
            if (*(short *)pcVar2 == 0) {
              if (*(short *)((long)eName + lVar5) == 0) goto LAB_002751bf;
              break;
            }
            psVar1 = (short *)((long)eName + lVar5);
            lVar5 = lVar5 + 2;
          } while (*(short *)pcVar2 == *psVar1);
        }
        pp_Var10 = (_func_int **)*pp_Var11;
      } while ((_func_int **)*pp_Var11 != (_func_int **)0x0);
    }
    iVar3 = (*ownerDoc[-1].super_DOMNode._vptr_DOMNode[4])
                      (&ownerDoc[-1].super_DOMNode,(long)p_Var7 * 2 + 0x18);
    p_Var6 = (_func_int *)CONCAT44(extraout_var,iVar3);
    *pp_Var11 = p_Var6;
    *(_func_int **)(p_Var6 + 8) = p_Var7;
    *(undefined8 *)p_Var6 = 0;
    pp_Var10 = (_func_int **)(p_Var6 + 0x10);
    XMLString::copyString((XMLCh *)pp_Var10,eName);
  }
LAB_002751bf:
  this->fName = (XMLCh *)pp_Var10;
  DOMNodeImpl::setReadOnly(&this->fNode,true,true);
  return;
}

Assistant:

DOMEntityImpl::DOMEntityImpl(DOMDocument *ownerDoc, const XMLCh *eName)
   : fNode(this, ownerDoc),
     fParent(this, ownerDoc),
     fPublicId(0),
     fSystemId(0),
     fNotationName(0),
     fRefEntity(0),
     fInputEncoding(0),
     fXmlEncoding(0),
     fXmlVersion(0),
     fBaseURI(0),
     fEntityRefNodeCloned(false)
{
    fName        = ((DOMDocumentImpl *)ownerDoc)->getPooledString(eName);
    fNode.setReadOnly(true, true);
}